

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol_check_data.h
# Opt level: O1

void __thiscall
mp::VarInfoImpl<mp::VarVecRecomp>::VarInfoImpl
          (VarInfoImpl<mp::VarVecRecomp> *this,double ft,bool recomp_vals,VarVecRecomp *x,
          ArrayRef<double> *x_raw,ArrayRef<mp::var::Type> *type,ArrayRef<double> *lb,
          ArrayRef<double> *ub,int sol_rnd,int sol_prec)

{
  pointer pdVar1;
  _Bit_type *p_Var2;
  undefined8 uVar3;
  undefined8 uVar4;
  
  this->feastol_ = ft;
  this->recomp_vals_ = recomp_vals;
  pdVar1 = (x->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->x_).x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (x->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  (this->x_).x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = pdVar1;
  (this->x_).x_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (x->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  (x->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (x->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (x->x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->x_).is_recomp_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage =
       (x->is_recomp_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_end_of_storage;
  p_Var2 = (x->is_recomp_).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  uVar3 = *(undefined8 *)
           &(x->is_recomp_).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset;
  uVar4 = *(undefined8 *)
           &(x->is_recomp_).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
  (this->x_).is_recomp_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p =
       (x->is_recomp_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_p;
  *(undefined8 *)
   ((long)&(this->x_).is_recomp_.super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8) = uVar4;
  (this->x_).is_recomp_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = p_Var2;
  *(undefined8 *)
   ((long)&(this->x_).is_recomp_.super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base + 8) = uVar3;
  (x->is_recomp_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (x->is_recomp_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  (x->is_recomp_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (x->is_recomp_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (x->is_recomp_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  (this->x_).recomp_fn_.super__Function_base._M_manager = (_Manager_type)0x0;
  *(undefined8 *)&(this->x_).recomp_fn_.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->x_).recomp_fn_.super__Function_base._M_functor + 8) = 0;
  (this->x_).recomp_fn_._M_invoker = (x->recomp_fn_)._M_invoker;
  if ((x->recomp_fn_).super__Function_base._M_manager != (_Manager_type)0x0) {
    uVar3 = *(undefined8 *)((long)&(x->recomp_fn_).super__Function_base._M_functor + 8);
    *(undefined8 *)&(this->x_).recomp_fn_.super__Function_base._M_functor =
         *(undefined8 *)&(x->recomp_fn_).super__Function_base._M_functor;
    *(undefined8 *)((long)&(this->x_).recomp_fn_.super__Function_base._M_functor + 8) = uVar3;
    (this->x_).recomp_fn_.super__Function_base._M_manager =
         (x->recomp_fn_).super__Function_base._M_manager;
    (x->recomp_fn_).super__Function_base._M_manager = (_Manager_type)0x0;
    (x->recomp_fn_)._M_invoker = (_Invoker_type)0x0;
  }
  (this->x_).p_var_info_recomp_ = x->p_var_info_recomp_;
  (this->x_raw_).save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->x_raw_).save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->x_raw_).save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->x_raw_).data_ = x_raw->data_;
  (this->x_raw_).size_ = x_raw->size_;
  (this->type_).save_.super__Vector_base<mp::var::Type,_std::allocator<mp::var::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->type_).save_.super__Vector_base<mp::var::Type,_std::allocator<mp::var::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->type_).save_.super__Vector_base<mp::var::Type,_std::allocator<mp::var::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->type_).data_ = type->data_;
  (this->type_).size_ = type->size_;
  (this->lb_).save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->lb_).save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->lb_).save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->lb_).data_ = lb->data_;
  (this->lb_).size_ = lb->size_;
  (this->ub_).save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ub_).save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ub_).save_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ub_).data_ = ub->data_;
  (this->ub_).size_ = ub->size_;
  this->sol_rnd_ = 100;
  this->sol_prec_ = 100;
  apply_precision_options(this,sol_rnd,sol_prec);
  return;
}

Assistant:

VarInfoImpl(double ft, bool recomp_vals,
              VarVec x,
              ArrayRef<double> x_raw,
              ArrayRef<var::Type> type,
              ArrayRef<double> lb, ArrayRef<double> ub,
              int sol_rnd, int sol_prec)
      : feastol_(ft), recomp_vals_(recomp_vals),
      x_(std::move(x)), x_raw_(x_raw),
      type_(type), lb_(lb), ub_(ub) {
    assert((int)x_.size()>=(int)type_.size());  // feasrelax can add more
    assert(type_.size()==lb_.size());
    assert(type_.size()==ub_.size());
    apply_precision_options(sol_rnd, sol_prec); // after recomp?
  }